

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_get_chunk_count(exr_const_context_t ctxt,int part_index,int32_t *out)

{
  undefined4 uVar1;
  long lVar2;
  exr_result_t eVar3;
  exr_const_context_t in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_RDX);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_RDX);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar2 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (exr_const_context_t)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock((exr_const_context_t)0x0);
        }
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else {
        if (*(long *)(lVar2 + 0x30) != 0) {
          if ((*(int *)(lVar2 + 4) == 1) || (*(int *)(lVar2 + 4) == 3)) {
            if (*(long *)(lVar2 + 0x60) != 0) {
              uVar1 = *(undefined4 *)(lVar2 + 0xf4);
              in_RDX->mode = (char)uVar1;
              in_RDX->version = (char)((uint)uVar1 >> 8);
              in_RDX->max_name_length = (char)((uint)uVar1 >> 0x10);
              in_RDX->is_singlepart_tiled = (char)((uint)uVar1 >> 0x18);
              if (*in_RDI == '\x01') {
                internal_exr_unlock(in_RDX);
              }
              return 0;
            }
            if (*in_RDI == '\x01') {
              internal_exr_unlock(in_RDX);
            }
            eVar3 = (**(code **)(in_RDI + 0x40))(in_RDI,0xd,"Tile data missing or corrupt");
            return eVar3;
          }
          if ((*(int *)(lVar2 + 4) == 0) || (*(int *)(lVar2 + 4) == 2)) {
            if (*(long *)(lVar2 + 0x28) != 0) {
              uVar1 = *(undefined4 *)(lVar2 + 0xf4);
              in_RDX->mode = (char)uVar1;
              in_RDX->version = (char)((uint)uVar1 >> 8);
              in_RDX->max_name_length = (char)((uint)uVar1 >> 0x10);
              in_RDX->is_singlepart_tiled = (char)((uint)uVar1 >> 0x18);
              if (*in_RDI == '\x01') {
                internal_exr_unlock(in_RDX);
              }
              return 0;
            }
            if (*in_RDI == '\x01') {
              internal_exr_unlock(in_RDX);
            }
            eVar3 = (**(code **)(in_RDI + 0x40))
                              (in_RDI,0xd,"Missing scanline chunk compression information");
            return eVar3;
          }
          if (*(int *)(lVar2 + 4) == 5) {
            uVar1 = *(undefined4 *)(lVar2 + 0xf4);
            in_RDX->mode = (char)uVar1;
            in_RDX->version = (char)((uint)uVar1 >> 8);
            in_RDX->max_name_length = (char)((uint)uVar1 >> 0x10);
            in_RDX->is_singlepart_tiled = (char)((uint)uVar1 >> 0x18);
            if (*in_RDI == '\x01') {
              internal_exr_unlock(in_RDX);
            }
            return 0;
          }
        }
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,0xd,"Missing data window for chunk information");
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_chunk_count (exr_const_context_t ctxt, int part_index, int32_t* out)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!out)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (part->dataWindow)
    {
        if (part->storage_mode == EXR_STORAGE_TILED ||
            part->storage_mode == EXR_STORAGE_DEEP_TILED)
        {
            if (part->tiles)
            {
                *out = part->chunk_count;
                return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
            }
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }
        else if (
            part->storage_mode == EXR_STORAGE_SCANLINE ||
            part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (part->compression)
            {
                *out = part->chunk_count;
                return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
            }
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Missing scanline chunk compression information"));
        }
        else if (part->storage_mode == EXR_STORAGE_UNKNOWN)
        {
            *out = part->chunk_count;
            return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
        }
    }

    return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->report_error (
        ctxt,
        EXR_ERR_MISSING_REQ_ATTR,
        "Missing data window for chunk information"));
}